

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTestCase.cpp
# Opt level: O2

void __thiscall
SuiteParserTests::TestreadMessagesByteByByte::TestreadMessagesByteByByte
          (TestreadMessagesByteByByte *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"readMessagesByteByByte","ParserTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/ParserTestCase.cpp"
             ,0x94);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031ec90;
  return;
}

Assistant:

TEST(readMessagesByteByByte)
{
  Parser object;
  std::string fixMsg;
  std::string fixMsg1 = "8=FIX.4.2\0019=54\00135=i\001117=1\001296=1\001302=A\001"
                        "311=DELL\001364=10\001365=DELL\001COMP\001\00110=152\001";
  std::string fixMsg2 = "8=FIX.4.2\0019=17\00135=4\00136=88\001123=Y\00110=34\001";
  std::string fixMsg3 = "8=FIX.4.2\0019=19\00135=A\001108=30\0019710=8\00110=31\001";
  
  for( unsigned int i = 0; i < fixMsg1.length(); ++i )
  {
    object.addToStream( fixMsg1.c_str() + i, 1 );
  }
}